

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O2

SQRESULT declare_stream(HSQUIRRELVM v,SQChar *name,SQUserPointer typetag,SQChar *reg_name,
                       SQRegFunction *methods,SQRegFunction *globals)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  SQRESULT SVar4;
  SQRegFunction *f;
  SQRegFunction *f_1;
  
  iVar1 = sq_gettype(v,0xffffffffffffffff);
  if (iVar1 != 0xa000020) {
    SVar4 = sq_throwerror(v,"table expected");
    return SVar4;
  }
  uVar2 = sq_gettop(v);
  init_streamclass(v);
  sq_pushregistrytable(v);
  SVar4 = -1;
  sq_pushstring(v,reg_name,0xffffffffffffffff);
  sq_pushstring(v,"std_stream",0xffffffffffffffff);
  lVar3 = sq_get(v,0xfffffffffffffffd);
  if (-1 < lVar3) {
    sq_newclass(v,1);
    sq_settypetag(v,0xffffffffffffffff,typetag);
    for (; methods->name != (SQChar *)0x0; methods = methods + 1) {
      sq_pushstring(v,methods->name,0xffffffffffffffff);
      sq_newclosure(v,methods->f,0);
      sq_setparamscheck(v,methods->nparamscheck,methods->typemask);
      sq_setnativeclosurename(v,0xffffffffffffffff,methods->name);
      sq_newslot(v,0xfffffffffffffffd,0);
    }
    sq_newslot(v,0xfffffffffffffffd,0);
    sq_pop(v,1);
    for (; globals->name != (SQChar *)0x0; globals = globals + 1) {
      sq_pushstring(v,globals->name,0xffffffffffffffff);
      sq_newclosure(v,globals->f,0);
      sq_setparamscheck(v,globals->nparamscheck,globals->typemask);
      sq_setnativeclosurename(v,0xffffffffffffffff,globals->name);
      sq_newslot(v,0xfffffffffffffffd,0);
    }
    sq_pushstring(v,name,0xffffffffffffffff);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,0xffffffffffffffff);
    sq_get(v,0xfffffffffffffffe);
    sq_remove(v,0xfffffffffffffffe);
    SVar4 = 0;
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  sq_settop(v,uVar2);
  return SVar4;
}

Assistant:

SQRESULT declare_stream(HSQUIRRELVM v,const SQChar* name,SQUserPointer typetag,const SQChar* reg_name,const SQRegFunction *methods,const SQRegFunction *globals)
{
    if(sq_gettype(v,-1) != OT_TABLE)
        return sq_throwerror(v,_SC("table expected"));
    SQInteger top = sq_gettop(v);
    //create delegate
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-3))) {
        sq_newclass(v,SQTrue);
        sq_settypetag(v,-1,typetag);
        SQInteger i = 0;
        while(methods[i].name != 0) {
            const SQRegFunction &f = methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);

        i = 0;
        while(globals[i].name!=0)
        {
            const SQRegFunction &f = globals[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        //register the class in the target table
        sq_pushstring(v,name,-1);
        sq_pushregistrytable(v);
        sq_pushstring(v,reg_name,-1);
        sq_get(v,-2);
        sq_remove(v,-2);
        sq_newslot(v,-3,SQFalse);

        sq_settop(v,top);
        return SQ_OK;
    }
    sq_settop(v,top);
    return SQ_ERROR;
}